

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O0

void QWindowContainer::parentWasLowered(QWidget *parent)

{
  bool bVar1;
  QWindowContainerPrivate *pQVar2;
  QWindow *pQVar3;
  long lVar4;
  QWindowContainerPrivate *d;
  QWidget *in_stack_ffffffffffffffe8;
  
  pQVar2 = QWindowContainerPrivate::get(in_stack_ffffffffffffffe8);
  if (pQVar2 != (QWindowContainerPrivate *)0x0) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWindow> *)0x3bb315);
    if (!bVar1) {
      return;
    }
    pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3bb32c);
    lVar4 = QWindow::parent(pQVar3,0);
    if (lVar4 != 0) {
      QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3bb34d);
      QWindow::lower();
    }
  }
  qwindowcontainer_traverse(parent,(qwindowcontainer_traverse_callback)d);
  return;
}

Assistant:

void QWindowContainer::parentWasLowered(QWidget *parent)
{
    if (QWindowContainerPrivate *d = QWindowContainerPrivate::get(parent)) {
        if (!d->window)
            return;
        else if (d->window->parent())
            d->window->lower();
    }
    qwindowcontainer_traverse(parent, parentWasLowered);
}